

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
          *value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *this_00;
  Rep *pRVar5;
  Type *pTVar6;
  Type *result;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *value_local;
  RepeatedPtrFieldBase *this_local;
  
  iVar3 = this->current_size_;
  iVar2 = allocated_size(this);
  if (iVar3 < iVar2) {
    iVar3 = ExchangeCurrentSize(this,this->current_size_ + 1);
    ppvVar4 = element_at(this,iVar3);
    this_00 = cast<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                        (*ppvVar4);
    proto2_unittest::TestAllTypes_NestedMessage::operator=(this_00,value);
  }
  else {
    MaybeExtend(this);
    bVar1 = using_sso(this);
    if (!bVar1) {
      pRVar5 = rep(this);
      pRVar5->allocated_size = pRVar5->allocated_size + 1;
    }
    pTVar6 = GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>::New
                       (this->arena_,value);
    iVar3 = ExchangeCurrentSize(this,this->current_size_ + 1);
    ppvVar4 = element_at(this,iVar3);
    *ppvVar4 = pTVar6;
  }
  return;
}

Assistant:

inline void Add(Value<TypeHandler>&& value) {
    static_assert(std::is_move_constructible<Value<TypeHandler>>::value, "");
    static_assert(std::is_move_assignable<Value<TypeHandler>>::value, "");
    if (current_size_ < allocated_size()) {
      *cast<TypeHandler>(element_at(ExchangeCurrentSize(current_size_ + 1))) =
          std::move(value);
      return;
    }
    MaybeExtend();
    if (!using_sso()) ++rep()->allocated_size;
    auto* result = TypeHandler::New(arena_, std::move(value));
    element_at(ExchangeCurrentSize(current_size_ + 1)) = result;
  }